

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_108;
  Message local_100 [2];
  system_error *anon_var_0;
  type e;
  byte local_b1;
  undefined1 local_b0 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  memset(local_b0,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_b0);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_b0);
  if (bVar1) {
    local_b1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)
                 ((long)&gtest_msg.value.field_2 + 8));
    }
    if ((local_b1 & 1) != 0) goto LAB_00210611;
    std::__cxx11::string::operator=
              ((string *)local_b0,
               "Expected: mtx.unlock_shared() throws an exception of type std::system_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_100);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_108,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x163,message);
  testing::internal::AssertHelper::operator=(&local_108,local_100);
  testing::internal::AssertHelper::~AssertHelper(&local_108);
  testing::Message::~Message(local_100);
LAB_00210611:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_b0);
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)
             (gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, InvalidUnlockShared0) {
  TypeParam mtx;
  EXPECT_CHECK_FAILURE(mtx.unlock_shared());
}